

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_Type.h
# Opt level: O1

bool __thiscall soul::Type::isValidArrayOrVectorRange<long>(Type *this,long start,long end)

{
  bool bVar1;
  ulong uVar2;
  
  bVar1 = isValidArrayOrVectorIndex<long>(this,start);
  if (bVar1) {
    bVar1 = isValidArrayOrVectorIndex<long>(this,end);
    if (!bVar1) {
      if ((this->category & ~primitive) != vector) goto LAB_001dcaff;
      if (this->boundingSize != end) goto LAB_001dcaf7;
    }
    if (start < 0) {
      if ((this->category & ~primitive) != vector) goto LAB_001dcaff;
      start = start + this->boundingSize;
    }
    uVar2 = end;
    if (end < 0) {
      if ((this->category & ~primitive) != vector) {
LAB_001dcaff:
        throwInternalCompilerError("isArrayOrVector()","getArrayOrVectorSize",0x137);
      }
      uVar2 = this->boundingSize + end;
    }
    bVar1 = end != 0 && (ulong)start < uVar2;
  }
  else {
LAB_001dcaf7:
    bVar1 = false;
  }
  return bVar1;
}

Assistant:

bool isValidArrayOrVectorRange (IntType start, IntType end) const
    {
        return isValidArrayOrVectorIndex (start)
                && (isValidArrayOrVectorIndex (end) || (ArraySize) end == getArrayOrVectorSize())
                && convertArrayOrVectorIndexToValidRange (start) < convertArrayOrVectorIndexToValidRange (end)
                && end != 0;
    }